

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_constraints.cc
# Opt level: O1

bool __thiscall bssl::NameConstraints::IsPermittedIP(NameConstraints *this,Input ip)

{
  pointer ppVar1;
  bool bVar2;
  pair<bssl::der::Input,_bssl::der::Input> *permitted_ip;
  pointer ppVar3;
  pointer ppVar4;
  bool bVar5;
  
  ppVar4 = (this->excluded_subtrees_).ip_address_ranges.
           super__Vector_base<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->excluded_subtrees_).ip_address_ranges.
           super__Vector_base<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = ppVar4 == ppVar1;
  if (!bVar5) {
    bVar2 = IPAddressMatchesWithNetmask
                      (ip,(Input)(ppVar4->first).data_,(Input)(ppVar4->second).data_);
    while (!bVar2) {
      ppVar3 = ppVar4 + 1;
      bVar5 = ppVar3 == ppVar1;
      if (bVar5) goto LAB_004aeddb;
      bVar2 = IPAddressMatchesWithNetmask
                        (ip,(Input)(ppVar3->first).data_,(Input)ppVar4[1].second.data_);
      ppVar4 = ppVar3;
    }
    if (!bVar5) {
      return false;
    }
  }
LAB_004aeddb:
  if (((this->permitted_subtrees_).present_name_types & 0x80) == 0) {
    return true;
  }
  ppVar4 = (this->permitted_subtrees_).ip_address_ranges.
           super__Vector_base<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->permitted_subtrees_).ip_address_ranges.
           super__Vector_base<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar4 != ppVar1) {
    bVar5 = false;
    do {
      bVar2 = IPAddressMatchesWithNetmask
                        (ip,(Input)(ppVar4->first).data_,(Input)(ppVar4->second).data_);
      bVar5 = (bool)(bVar5 | bVar2);
      if (bVar2) {
        return bVar5;
      }
      ppVar4 = ppVar4 + 1;
    } while (ppVar4 != ppVar1);
  }
  return false;
}

Assistant:

bool NameConstraints::IsPermittedIP(der::Input ip) const {
  for (const auto &excluded_ip : excluded_subtrees_.ip_address_ranges) {
    if (IPAddressMatchesWithNetmask(ip, excluded_ip.first,
                                    excluded_ip.second)) {
      return false;
    }
  }

  // If permitted subtrees are not constrained, any name that is not excluded is
  // allowed.
  if (!(permitted_subtrees_.present_name_types & GENERAL_NAME_IP_ADDRESS)) {
    return true;
  }

  for (const auto &permitted_ip : permitted_subtrees_.ip_address_ranges) {
    if (IPAddressMatchesWithNetmask(ip, permitted_ip.first,
                                    permitted_ip.second)) {
      return true;
    }
  }

  return false;
}